

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int call_extract_if_dead(connectdata *conn,void *param)

{
  _Bool _Var1;
  prunedead *p;
  void *param_local;
  connectdata *conn_local;
  
  conn->data = *param;
  _Var1 = extract_if_dead(conn,*param);
  if (_Var1) {
    *(connectdata **)((long)param + 8) = conn;
  }
  conn_local._4_4_ = (uint)_Var1;
  return conn_local._4_4_;
}

Assistant:

static int call_extract_if_dead(struct connectdata *conn, void *param)
{
  struct prunedead *p = (struct prunedead *)param;
  conn->data = p->data; /* transfer to use for this check */
  if(extract_if_dead(conn, p->data)) {
    /* stop the iteration here, pass back the connection that was extracted */
    p->extracted = conn;
    return 1;
  }
  return 0; /* continue iteration */
}